

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.h
# Opt level: O3

int __thiscall jaegertracing::net::Socket::close(Socket *this,int __fd)

{
  int in_EAX;
  
  if (-1 < this->_handle) {
    in_EAX = ::close(this->_handle);
    this->_handle = -1;
  }
  return in_EAX;
}

Assistant:

void close() noexcept
    {
        if (_handle >= 0) {
#ifdef WIN32
            ::closesocket(_handle);
#else
            ::close(_handle);
#endif
            _handle = -1;
        }
    }